

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O2

void show_flag_cmds(CHAR_DATA *ch,flag_type *flag_table)

{
  size_t sVar1;
  uint uVar2;
  bool *pbVar3;
  char buf1 [4608];
  char buf [4608];
  char local_2438 [4608];
  char local_1238 [4616];
  
  local_2438[0] = '\0';
  uVar2 = 0;
  for (pbVar3 = &flag_table->settable; ((flag_type *)(pbVar3 + -0x10))->name != (char *)0x0;
      pbVar3 = pbVar3 + 0x18) {
    if (*pbVar3 == true) {
      sprintf(local_1238,"%-19.18s");
      strcat(local_2438,local_1238);
      uVar2 = uVar2 + 1;
      if ((uVar2 & 3) == 0) {
        sVar1 = strlen(local_2438);
        (local_2438 + sVar1)[0] = '\n';
        (local_2438 + sVar1)[1] = '\r';
        local_2438[sVar1 + 2] = '\0';
      }
    }
  }
  if ((uVar2 & 3) != 0) {
    sVar1 = strlen(local_2438);
    (local_2438 + sVar1)[0] = '\n';
    (local_2438 + sVar1)[1] = '\r';
    local_2438[sVar1 + 2] = '\0';
  }
  send_to_char(local_2438,ch);
  return;
}

Assistant:

void show_flag_cmds(CHAR_DATA *ch, const struct flag_type *flag_table)
{
	char buf[MAX_STRING_LENGTH];
	char buf1[MAX_STRING_LENGTH];
	int flag;
	int col;

	buf1[0] = '\0';
	col = 0;

	for (flag = 0; flag_table[flag].name != nullptr; flag++)
	{
		if (flag_table[flag].settable)
		{
			sprintf(buf, "%-19.18s", flag_table[flag].name);
			strcat(buf1, buf);

			if (++col % 4 == 0)
				strcat(buf1, "\n\r");
		}
	}

	if (col % 4 != 0)
		strcat(buf1, "\n\r");

	send_to_char(buf1, ch);
}